

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * DollSerialize_abi_cxx11_(string *__return_storage_ptr__,array<int,_15UL> *list)

{
  int extraout_EDX;
  int subject;
  int extraout_EDX_00;
  string local_60;
  uint local_3c;
  const_iterator pvStack_38;
  value_type_conflict1 item;
  const_iterator __end1;
  const_iterator __begin1;
  array<int,_15UL> *__range1;
  array<int,_15UL> *local_18;
  array<int,_15UL> *list_local;
  string *serialized;
  
  __range1._7_1_ = 0;
  local_18 = list;
  list_local = (array<int,_15UL> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __begin1 = local_18->_M_elems;
  __end1 = std::array<int,_15UL>::begin(local_18);
  pvStack_38 = std::array<int,_15UL>::end((array<int,_15UL> *)__begin1);
  subject = extraout_EDX;
  for (; __end1 != pvStack_38; __end1 = __end1 + 1) {
    local_3c = *__end1;
    util::to_string_abi_cxx11_(&local_60,(util *)(ulong)local_3c,subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    subject = extraout_EDX_00;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DollSerialize(const std::array<int, 15> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, item)
	{
		serialized.append(util::to_string(item));
		serialized.append(",");
	}

	return serialized;
}